

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

atomic<google::protobuf::internal::SerialArena_*> * __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::arena
          (SerialArenaChunk *this,uint32_t i)

{
  void *__src;
  long lVar1;
  string *__src_00;
  size_type __n;
  void **__dest;
  undefined8 *extraout_RDX;
  new_allocator<void_*> *this_00;
  size_t sVar2;
  void *__dest_00;
  new_allocator<void_*> local_20 [16];
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
                 );
  }
  if (i < *(uint *)(this + 8)) {
    __src_00 = (string *)0x0;
  }
  else {
    __src_00 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)i,(ulong)*(uint *)(this + 8),"i < capacity()");
  }
  if (__src_00 == (string *)0x0) {
    return (atomic<google::protobuf::internal::SerialArena_*> *)
           (this + (ulong)i * 8 + (ulong)*(uint *)(this + 8) * 8 + 0x10);
  }
  this_00 = local_20;
  arena();
  __n = std::vector<void_*,_std::allocator<void_*>_>::_M_check_len
                  ((vector<void_*,_std::allocator<void_*>_> *)this_00,1,"vector::_M_realloc_insert")
  ;
  __src = *(void **)this_00;
  lVar1 = *(long *)(this_00 + 8);
  sVar2 = (long)__src_00 - (long)__src;
  if (__n == 0) {
    __dest = (void **)0x0;
  }
  else {
    __dest = __gnu_cxx::new_allocator<void_*>::allocate(this_00,__n,(void *)0x0);
  }
  __dest[(long)sVar2 >> 3] = (void *)*extraout_RDX;
  if (0 < (long)sVar2) {
    memmove(__dest,__src,sVar2);
  }
  __dest_00 = (void *)((long)__dest + sVar2 + 8);
  sVar2 = lVar1 - (long)__src_00;
  if (0 < (long)sVar2) {
    memmove(__dest_00,__src_00,sVar2);
  }
  if (__src != (void *)0x0) {
    operator_delete(__src,*(long *)(this_00 + 0x10) - (long)__src);
  }
  *(void ***)this_00 = __dest;
  *(size_t *)(this_00 + 8) = (long)__dest_00 + sVar2;
  *(atomic<google::protobuf::internal::SerialArena_*> **)(this_00 + 0x10) =
       (atomic<google::protobuf::internal::SerialArena_*> *)(__dest + __n);
  return (atomic<google::protobuf::internal::SerialArena_*> *)(__dest + __n);
}

Assistant:

std::atomic<SerialArena*>& arena(uint32_t i) {
    ABSL_DCHECK_LT(i, capacity());
    return Layout().Pointer<kArenas>(ptr())[i];
  }